

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TVA.cpp
# Opt level: O3

void __thiscall MT32Emu::TVA::startRamp(TVA *this,Bit8u newTarget,Bit8u newIncrement,int newPhase)

{
  this->target = newTarget;
  this->phase = newPhase;
  LA32Ramp::startRamp(this->ampRamp,newTarget,newIncrement);
  return;
}

Assistant:

void TVA::startRamp(Bit8u newTarget, Bit8u newIncrement, int newPhase) {
	target = newTarget;
	phase = newPhase;
	ampRamp->startRamp(newTarget, newIncrement);
#if MT32EMU_MONITOR_TVA >= 1
	partial->getSynth()->printDebug("[+%lu] [Partial %d] TVA,ramp,%x,%s%x,%d", partial->debugGetSampleNum(), partial->debugGetPartialNum(), newTarget, (newIncrement & 0x80) ? "-" : "+", (newIncrement & 0x7F), newPhase);
#endif
}